

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

Orphan<capnp::DynamicValue> * __thiscall
capnp::JsonCodec::decode
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,JsonCodec *this,Reader input,
          Type type,Orphanage orphanage)

{
  word **__return_storage_ptr___00;
  size_t *__return_storage_ptr___01;
  HandlerBase *pHVar1;
  size_t index;
  code *pcVar2;
  double dVar3;
  Reader input_00;
  Enumerant enumerant;
  Builder output;
  Orphanage orphanage_00;
  Orphanage orphanage_01;
  Reader input_01;
  word *type_00;
  JsonCodec *pJVar4;
  BuilderArena *pBVar5;
  bool bVar6;
  Which WVar7;
  Which WVar8;
  uint size;
  Impl *pIVar9;
  long value;
  unsigned_long value_00;
  unsigned_long *puVar10;
  uchar *puVar11;
  Orphan<capnp::Data> *other;
  EnumSchema schema;
  Orphan<capnp::DynamicStruct> *other_00;
  Reader *__tagb;
  Reader copyFrom;
  BuilderFor<capnp::Data> BVar12;
  Range<unsigned_long> RVar13;
  ListSchema type_01;
  DynamicEnum value_01;
  DynamicEnum value_02;
  undefined4 uVar14;
  Fault local_448;
  Fault f_10;
  Fault f_9;
  SegmentBuilder *pSStack_430;
  CapTableBuilder *local_428;
  void *pvStack_420;
  WirePointer *local_418;
  undefined8 uStack_410;
  undefined1 local_3a8 [8];
  Orphan<capnp::DynamicStruct> orphan_1;
  StructSchema structType;
  DynamicEnum local_370;
  Fault local_360;
  Fault f_8;
  Schema local_338;
  Enumerant local_330;
  DynamicEnum local_2f0;
  Type local_2e0;
  Orphan<capnp::DynamicList> local_2d0;
  Fault local_2a0;
  Fault f_7;
  Reader local_270;
  Orphan<capnp::DynamicList> local_240;
  Fault local_210;
  Fault f_6;
  Fault f_5;
  double x;
  unsigned_long i;
  Iterator __end4;
  Iterator __begin4;
  Range<unsigned_long> *__range4;
  BuilderFor<capnp::Data> data;
  Orphan<capnp::Data> orphan;
  Reader array;
  Fault f_4;
  Orphan<capnp::Text> local_120;
  Fault local_100;
  Fault f_3;
  Fault local_e8;
  Fault f_2;
  Fault local_d0;
  Fault f_1;
  Fault local_a8;
  Fault f;
  undefined1 local_78 [48];
  Maybe<capnp::JsonCodec::HandlerBase_*const_&> local_48;
  HandlerBase **local_40;
  HandlerBase **handler;
  JsonCodec *this_local;
  Orphanage orphanage_local;
  Type type_local;
  
  orphanage_local.arena = (BuilderArena *)orphanage.capTable;
  this_local = (JsonCodec *)orphanage.arena;
  orphanage_local.capTable = type._0_8_;
  handler = (HandlerBase **)this;
  pIVar9 = kj::Own<capnp::JsonCodec::Impl>::operator->(&this->impl);
  local_48 = kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::find<capnp::Type&>
                       ((HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*> *)&pIVar9->typeHandlers
                        ,(Type *)&orphanage_local.capTable);
  local_40 = kj::_::readMaybe<capnp::JsonCodec::HandlerBase*const>(&local_48);
  if (local_40 == (HandlerBase **)0x0) {
    WVar7 = capnp::Type::which((Type *)&orphanage_local.capTable);
    switch(WVar7) {
    case VOID:
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__);
      break;
    case BOOL:
      WVar8 = json::Value::Reader::which(&input);
      if (WVar8 != BOOLEAN) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                  (&local_a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                   ,0x1ad,FAILED,(char *)0x0,"\"Expected boolean value\"",
                   (char (*) [23])"Expected boolean value");
        kj::_::Debug::Fault::fatal(&local_a8);
      }
      bVar6 = json::Value::Reader::getBoolean(&input);
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,bVar6);
      break;
    case INT8:
    case INT16:
    case INT32:
    case INT64:
      WVar8 = json::Value::Reader::which(&input);
      if (WVar8 == NUMBER) {
        dVar3 = json::Value::Reader::getNumber(&input);
        Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,dVar3);
      }
      else {
        if (WVar8 != STRING) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                    (&local_d0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                     ,0x1ba,FAILED,(char *)0x0,"\"Expected integer value\"",
                     (char (*) [23])"Expected integer value");
          kj::_::Debug::Fault::fatal(&local_d0);
        }
        _f_1 = (ArrayPtr<const_char>)json::Value::Reader::getString(&input);
        value = kj::StringPtr::parseAs<long>((StringPtr *)&f_1);
        Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,value);
      }
      break;
    case UINT8:
    case UINT16:
    case UINT32:
    case UINT64:
      WVar8 = json::Value::Reader::which(&input);
      if (WVar8 == NUMBER) {
        dVar3 = json::Value::Reader::getNumber(&input);
        Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,dVar3);
      }
      else {
        if (WVar8 != STRING) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                    (&local_e8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                     ,0x1c7,FAILED,(char *)0x0,"\"Expected integer value\"",
                     (char (*) [23])"Expected integer value");
          kj::_::Debug::Fault::fatal(&local_e8);
        }
        _f_2 = (ArrayPtr<const_char>)json::Value::Reader::getString(&input);
        value_00 = kj::StringPtr::parseAs<unsigned_long>((StringPtr *)&f_2);
        Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,value_00);
      }
      break;
    case FLOAT32:
    case FLOAT64:
      __tagb = &input;
      WVar8 = json::Value::Reader::which(&input);
      if (WVar8 == NULL_) {
        dVar3 = kj::nan((char *)__tagb);
        Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,SUB84(dVar3,0));
      }
      else if (WVar8 == NUMBER) {
        dVar3 = json::Value::Reader::getNumber(&input);
        Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,dVar3);
      }
      else {
        if (WVar8 != STRING) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                    (&local_100,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                     ,0x1d3,FAILED,(char *)0x0,"\"Expected float value\"",
                     (char (*) [21])"Expected float value");
          kj::_::Debug::Fault::fatal(&local_100);
        }
        _f_3 = (ArrayPtr<const_char>)json::Value::Reader::getString(&input);
        dVar3 = kj::StringPtr::parseAs<double>((StringPtr *)&f_3);
        Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,dVar3);
      }
      break;
    case TEXT:
      WVar8 = json::Value::Reader::which(&input);
      if (WVar8 != STRING) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20]>
                  ((Fault *)&array.reader.nestingLimit,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                   ,0x1da,FAILED,(char *)0x0,"\"Expected text value\"",
                   (char (*) [20])"Expected text value");
        kj::_::Debug::Fault::fatal((Fault *)&array.reader.nestingLimit);
      }
      copyFrom = json::Value::Reader::getString(&input);
      Orphanage::newOrphanCopy<capnp::Text::Reader>(&local_120,(Orphanage *)&this_local,copyFrom);
      Orphan<capnp::DynamicValue>::Orphan<capnp::Text>(__return_storage_ptr__,&local_120);
      Orphan<capnp::Text>::~Orphan(&local_120);
      break;
    case DATA:
      WVar8 = json::Value::Reader::which(&input);
      if (WVar8 != ARRAY) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20]>
                  (&local_210,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                   ,0x1ea,FAILED,(char *)0x0,"\"Expected data value\"",
                   (char (*) [20])"Expected data value");
        kj::_::Debug::Fault::fatal(&local_210);
      }
      __return_storage_ptr___00 = &orphan.builder.location;
      json::Value::Reader::getArray((Reader *)__return_storage_ptr___00,&input);
      size = List<capnp::json::Value,_(capnp::Kind)3>::Reader::size
                       ((Reader *)__return_storage_ptr___00);
      __return_storage_ptr___01 = &data.super_ArrayPtr<unsigned_char>.size_;
      Orphanage::newOrphan<capnp::Data>
                ((Orphan<capnp::Data> *)__return_storage_ptr___01,(Orphanage *)&this_local,size);
      BVar12 = Orphan<capnp::Data>::get((Orphan<capnp::Data> *)__return_storage_ptr___01);
      data.super_ArrayPtr<unsigned_char>.ptr = (uchar *)BVar12.super_ArrayPtr<unsigned_char>.size_;
      __range4 = (Range<unsigned_long> *)BVar12.super_ArrayPtr<unsigned_char>.ptr;
      RVar13 = kj::indices<capnp::List<capnp::json::Value,(capnp::Kind)3>::Reader&>
                         ((Reader *)&orphan.builder.location);
      __begin4.value = RVar13.begin_;
      __end4 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin4);
      i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin4);
      while (bVar6 = kj::Range<unsigned_long>::Iterator::operator!=(&__end4,(Iterator *)&i), bVar6)
      {
        puVar10 = kj::Range<unsigned_long>::Iterator::operator*(&__end4);
        index = *puVar10;
        x._0_4_ = (uint)index;
        List<capnp::json::Value,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)&f_5,(Reader *)&orphan.builder.location,x._0_4_);
        dVar3 = json::Value::Reader::getNumber((Reader *)&f_5);
        if (((double)((int)dVar3 & 0xff) != dVar3) ||
           (NAN((double)((int)dVar3 & 0xff)) || NAN(dVar3))) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                    (&f_6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                     ,0x1e4,FAILED,"byte(x) == x",
                     "\"Number in byte array is not an integer in [0, 255]\"",
                     (char (*) [51])"Number in byte array is not an integer in [0, 255]");
          kj::_::Debug::Fault::fatal(&f_6);
        }
        puVar11 = kj::ArrayPtr<unsigned_char>::operator[]
                            ((ArrayPtr<unsigned_char> *)&__range4,index);
        *puVar11 = (uchar)(int)dVar3;
        kj::Range<unsigned_long>::Iterator::operator++(&__end4);
      }
      other = kj::mv<capnp::Orphan<capnp::Data>>
                        ((Orphan<capnp::Data> *)&data.super_ArrayPtr<unsigned_char>.size_);
      Orphan<capnp::DynamicValue>::Orphan<capnp::Data>(__return_storage_ptr__,other);
      Orphan<capnp::Data>::~Orphan((Orphan<capnp::Data> *)&data.super_ArrayPtr<unsigned_char>.size_)
      ;
      break;
    case LIST:
      WVar8 = json::Value::Reader::which(&input);
      if (WVar8 == ARRAY) {
        json::Value::Reader::getArray(&local_270,&input);
        type_01 = capnp::Type::asList((Type *)&orphanage_local.capTable);
        f_7.exception = (Exception *)this_local;
        orphanage_01.capTable = (CapTableBuilder *)orphanage_local.arena;
        orphanage_01.arena = (BuilderArena *)this_local;
        uVar14 = local_270.reader._36_4_;
        input_00.reader.capTable._0_4_ = (int)local_270.reader.capTable;
        input_00.reader.segment = local_270.reader.segment;
        input_00.reader.capTable._4_4_ = (int)((ulong)local_270.reader.capTable >> 0x20);
        input_00.reader.ptr._0_4_ = (int)local_270.reader.ptr;
        input_00.reader.ptr._4_4_ = (int)((ulong)local_270.reader.ptr >> 0x20);
        input_00.reader.elementCount = local_270.reader.elementCount;
        input_00.reader.step = local_270.reader.step;
        input_00.reader.structDataSize = local_270.reader.structDataSize;
        input_00.reader.structPointerCount = (short)uVar14;
        input_00.reader.elementSize = (char)((uint)uVar14 >> 0x10);
        input_00.reader._39_1_ = (char)((uint)uVar14 >> 0x18);
        input_00.reader.nestingLimit = local_270.reader.nestingLimit;
        input_00.reader._44_4_ = local_270.reader._44_4_;
        decodeArray(&local_240,this,input_00,type_01,orphanage_01);
        Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicList>(__return_storage_ptr__,&local_240);
        Orphan<capnp::DynamicList>::~Orphan(&local_240);
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20]>
                  (&local_2a0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                   ,0x1f1,FAILED,(char *)0x0,"\"Expected list value\"",
                   (char (*) [20])"Expected list value");
        kj::_::Debug::Fault::~Fault(&local_2a0);
        local_2e0 = (Type)capnp::Type::asList((Type *)&orphanage_local.capTable);
        Orphanage::newOrphan(&local_2d0,(Orphanage *)&this_local,(ListSchema)local_2e0,0);
        Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicList>(__return_storage_ptr__,&local_2d0);
        Orphan<capnp::DynamicList>::~Orphan(&local_2d0);
      }
      break;
    case ENUM:
      WVar8 = json::Value::Reader::which(&input);
      if (WVar8 == STRING) {
        local_338.raw = (RawBrandedSchema *)capnp::Type::asEnum((Type *)&orphanage_local.capTable);
        _f_8 = (ArrayPtr<const_char>)json::Value::Reader::getString(&input);
        EnumSchema::getEnumerantByName(&local_330,(EnumSchema *)&local_338,(StringPtr)_f_8);
        enumerant._8_4_ = local_330._8_4_;
        enumerant.parent.super_Schema.raw = local_330.parent.super_Schema.raw;
        enumerant._12_4_ = local_330._12_4_;
        enumerant.proto._reader.segment._0_4_ = (int)local_330.proto._reader.segment;
        enumerant.proto._reader.segment._4_4_ =
             (int)((ulong)local_330.proto._reader.segment >> 0x20);
        enumerant.proto._reader.capTable._0_4_ = (int)local_330.proto._reader.capTable;
        enumerant.proto._reader.capTable._4_4_ =
             (int)((ulong)local_330.proto._reader.capTable >> 0x20);
        enumerant.proto._reader.data._0_4_ = (int)local_330.proto._reader.data;
        enumerant.proto._reader.data._4_4_ = (int)((ulong)local_330.proto._reader.data >> 0x20);
        enumerant.proto._reader.pointers._0_4_ = (int)local_330.proto._reader.pointers;
        enumerant.proto._reader.pointers._4_4_ =
             (int)((ulong)local_330.proto._reader.pointers >> 0x20);
        enumerant.proto._reader.dataSize = local_330.proto._reader.dataSize;
        enumerant.proto._reader.pointerCount = local_330.proto._reader.pointerCount;
        enumerant.proto._reader._38_2_ = local_330.proto._reader._38_2_;
        enumerant.proto._reader.nestingLimit = local_330.proto._reader.nestingLimit;
        enumerant.proto._reader._44_4_ = local_330.proto._reader._44_4_;
        DynamicEnum::DynamicEnum(&local_2f0,enumerant);
        value_01._10_6_ = 0;
        value_01.schema.super_Schema.raw = local_2f0.schema.super_Schema.raw;
        value_01.value = local_2f0.value;
        Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,value_01);
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20]>
                  (&local_360,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                   ,0x1f9,FAILED,(char *)0x0,"\"Expected enum value\"",
                   (char (*) [20])"Expected enum value");
        kj::_::Debug::Fault::~Fault(&local_360);
        schema = capnp::Type::asEnum((Type *)&orphanage_local.capTable);
        DynamicEnum::DynamicEnum(&local_370,schema,0);
        value_02._10_6_ = 0;
        value_02.schema.super_Schema.raw = local_370.schema.super_Schema.raw;
        value_02.value = local_370.value;
        Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,value_02);
      }
      break;
    case STRUCT:
      orphan_1.builder.location = (word *)capnp::Type::asStruct((Type *)&orphanage_local.capTable);
      Orphanage::newOrphan
                ((Orphan<capnp::DynamicStruct> *)local_3a8,(Orphanage *)&this_local,
                 (StructSchema)orphan_1.builder.location);
      pBVar5 = orphanage_local.arena;
      pJVar4 = this_local;
      type_00 = orphan_1.builder.location;
      input_01 = input;
      Orphan<capnp::DynamicStruct>::get((Builder *)&f_9,(Orphan<capnp::DynamicStruct> *)local_3a8);
      orphanage_00.capTable = (CapTableBuilder *)pBVar5;
      orphanage_00.arena = (BuilderArena *)pJVar4;
      output.builder.segment = pSStack_430;
      output.schema.super_Schema.raw = (Schema)(Schema)f_9.exception;
      output.builder.capTable = local_428;
      output.builder.data = pvStack_420;
      output.builder.pointers = local_418;
      output.builder._32_8_ = uStack_410;
      decodeObject(this,input_01,(StructSchema)type_00,orphanage_00,output);
      other_00 = kj::mv<capnp::Orphan<capnp::DynamicStruct>>
                           ((Orphan<capnp::DynamicStruct> *)local_3a8);
      Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicStruct>(__return_storage_ptr__,other_00);
      Orphan<capnp::DynamicStruct>::~Orphan((Orphan<capnp::DynamicStruct> *)local_3a8);
      break;
    case INTERFACE:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[90]>
                (&f_10,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x204,FAILED,(char *)0x0,
                 "\"don\'t know how to JSON-decode capabilities; \" \"please register a JsonCodec::Handler for this\""
                 ,(char (*) [90])
                  "don\'t know how to JSON-decode capabilities; please register a JsonCodec::Handler for this"
                );
      kj::_::Debug::Fault::fatal(&f_10);
    case ANY_POINTER:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[88]>
                (&local_448,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x207,FAILED,(char *)0x0,
                 "\"don\'t know how to JSON-decode AnyPointer; \" \"please register a JsonCodec::Handler for this\""
                 ,(char (*) [88])
                  "don\'t know how to JSON-decode AnyPointer; please register a JsonCodec::Handler for this"
                );
      kj::_::Debug::Fault::fatal(&local_448);
    default:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  else {
    pHVar1 = *local_40;
    memcpy(local_78,&input,0x30);
    (*pHVar1->_vptr_HandlerBase[1])
              (__return_storage_ptr__,pHVar1,this,orphanage_local.capTable,type.field_4.schema);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> JsonCodec::decode(
    JsonValue::Reader input, Type type, Orphanage orphanage) const {
  KJ_IF_MAYBE(handler, impl->typeHandlers.find(type)) {
    return (*handler)->decodeBase(*this, input, type, orphanage);
  }

  switch(type.which()) {
    case schema::Type::VOID:
      return capnp::VOID;
    case schema::Type::BOOL:
      switch (input.which()) {
        case JsonValue::BOOLEAN:
          return input.getBoolean();
        default:
          KJ_FAIL_REQUIRE("Expected boolean value");
      }
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
      // Relies on range check in DynamicValue::Reader::as<IntType>
      switch (input.which()) {
        case JsonValue::NUMBER:
          return input.getNumber();
        case JsonValue::STRING:
          return input.getString().parseAs<int64_t>();
        default:
          KJ_FAIL_REQUIRE("Expected integer value");
      }
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
      // Relies on range check in DynamicValue::Reader::as<IntType>
      switch (input.which()) {
        case JsonValue::NUMBER:
          return input.getNumber();
        case JsonValue::STRING:
          return input.getString().parseAs<uint64_t>();
        default:
          KJ_FAIL_REQUIRE("Expected integer value");
      }
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
      switch (input.which()) {
        case JsonValue::NULL_:
          return kj::nan();
        case JsonValue::NUMBER:
          return input.getNumber();
        case JsonValue::STRING:
          return input.getString().parseAs<double>();
        default:
          KJ_FAIL_REQUIRE("Expected float value");
      }
    case schema::Type::TEXT:
      switch (input.which()) {
        case JsonValue::STRING:
          return orphanage.newOrphanCopy(input.getString());
        default:
          KJ_FAIL_REQUIRE("Expected text value");
      }
    case schema::Type::DATA:
      switch (input.which()) {
        case JsonValue::ARRAY: {
          auto array = input.getArray();
          auto orphan = orphanage.newOrphan<Data>(array.size());
          auto data = orphan.get();
          for (auto i: kj::indices(array)) {
            auto x = array[i].getNumber();
            KJ_REQUIRE(byte(x) == x, "Number in byte array is not an integer in [0, 255]");
            data[i] = x;
          }
          return kj::mv(orphan);
        }
        default:
          KJ_FAIL_REQUIRE("Expected data value");
      }
    case schema::Type::LIST:
      switch (input.which()) {
        case JsonValue::ARRAY:
          return decodeArray(input.getArray(), type.asList(), orphanage);
        default:
          KJ_FAIL_REQUIRE("Expected list value") { break; }
          return orphanage.newOrphan(type.asList(), 0);
      }
    case schema::Type::ENUM:
      switch (input.which()) {
        case JsonValue::STRING:
          return DynamicEnum(type.asEnum().getEnumerantByName(input.getString()));
        default:
          KJ_FAIL_REQUIRE("Expected enum value") { break; }
          return DynamicEnum(type.asEnum(), 0);
      }
    case schema::Type::STRUCT: {
      auto structType = type.asStruct();
      auto orphan = orphanage.newOrphan(structType);
      decodeObject(input, structType, orphanage, orphan.get());
      return kj::mv(orphan);
    }
    case schema::Type::INTERFACE:
      KJ_FAIL_REQUIRE("don't know how to JSON-decode capabilities; "
                      "please register a JsonCodec::Handler for this");
    case schema::Type::ANY_POINTER:
      KJ_FAIL_REQUIRE("don't know how to JSON-decode AnyPointer; "
                      "please register a JsonCodec::Handler for this");
  }

  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT;
}